

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcUif.c
# Opt level: O2

Vec_Int_t * Wlc_NtkCollectMultipliers(Wlc_Ntk_t *p)

{
  Vec_Int_t *p_00;
  Wlc_Obj_t *pWVar1;
  int Id;
  
  p_00 = Vec_IntAlloc(100);
  for (Id = 1; Id < p->iObj; Id = Id + 1) {
    pWVar1 = Wlc_NtkObj(p,Id);
    if ((undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x3f) ==
        (undefined1  [24])0x2d) {
      Vec_IntPush(p_00,Id);
    }
  }
  if (p_00->nSize < 1) {
    Vec_IntFree(p_00);
    p_00 = (Vec_Int_t *)0x0;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Wlc_NtkCollectMultipliers( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj;  int i;
    Vec_Int_t * vBoxIds = Vec_IntAlloc( 100 );
    Wlc_NtkForEachObj( p, pObj, i )
        if ( pObj->Type == WLC_OBJ_ARI_MULTI )
            Vec_IntPush( vBoxIds, i );
    if ( Vec_IntSize( vBoxIds ) > 0 )
        return vBoxIds;
    Vec_IntFree( vBoxIds );
    return NULL;
}